

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float in_register_000012dc;
  
  iVar9 = a->h * a->w * a->d * a->elempack;
  uVar12 = 0;
  uVar10 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar10 = uVar12;
  }
  for (; uVar12 != uVar10; uVar12 = uVar12 + 1) {
    lVar13 = b->elemsize * b->cstep * uVar12;
    pvVar3 = b->data;
    lVar15 = c->elemsize * c->cstep * uVar12;
    pvVar4 = c->data;
    lVar14 = a->elemsize * a->cstep * uVar12;
    pvVar5 = a->data;
    lVar11 = 0;
    lVar16 = 0;
    for (iVar17 = 0; iVar17 + 7 < iVar9; iVar17 = iVar17 + 8) {
      auVar2 = *(undefined1 (*) [32])((long)pvVar5 + lVar16 + lVar14);
      auVar19 = *(undefined1 (*) [32])((long)pvVar3 + lVar16 + lVar13);
      auVar7 = vrcpps_avx(auVar19);
      fVar21 = auVar2._0_4_ * auVar7._0_4_;
      fVar22 = auVar2._4_4_ * auVar7._4_4_;
      fVar23 = auVar2._8_4_ * auVar7._8_4_;
      fVar24 = auVar2._12_4_ * auVar7._12_4_;
      fVar25 = auVar2._16_4_ * auVar7._16_4_;
      fVar26 = auVar2._20_4_ * auVar7._20_4_;
      fVar27 = auVar2._24_4_ * auVar7._24_4_;
      auVar8._4_4_ = auVar19._4_4_ * fVar22;
      auVar8._0_4_ = auVar19._0_4_ * fVar21;
      auVar8._8_4_ = auVar19._8_4_ * fVar23;
      auVar8._12_4_ = auVar19._12_4_ * fVar24;
      auVar8._16_4_ = auVar19._16_4_ * fVar25;
      auVar8._20_4_ = auVar19._20_4_ * fVar26;
      auVar8._24_4_ = auVar19._24_4_ * fVar27;
      auVar8._28_4_ = auVar19._28_4_;
      auVar2 = vsubps_avx(auVar2,auVar8);
      auVar19._0_4_ = fVar21 + auVar7._0_4_ * auVar2._0_4_;
      auVar19._4_4_ = fVar22 + auVar7._4_4_ * auVar2._4_4_;
      auVar19._8_4_ = fVar23 + auVar7._8_4_ * auVar2._8_4_;
      auVar19._12_4_ = fVar24 + auVar7._12_4_ * auVar2._12_4_;
      auVar19._16_4_ = fVar25 + auVar7._16_4_ * auVar2._16_4_;
      auVar19._20_4_ = fVar26 + auVar7._20_4_ * auVar2._20_4_;
      auVar19._24_4_ = fVar27 + auVar7._24_4_ * auVar2._24_4_;
      auVar19._28_4_ = in_register_000012dc + auVar2._28_4_;
      *(undefined1 (*) [32])((long)pvVar4 + lVar16 + lVar15) = auVar19;
      lVar16 = lVar16 + 0x20;
      lVar11 = lVar11 + 8;
    }
    for (; iVar17 + 3 < iVar9; iVar17 = iVar17 + 4) {
      auVar1 = *(undefined1 (*) [16])((long)pvVar5 + lVar16 + lVar14);
      auVar18 = *(undefined1 (*) [16])((long)pvVar3 + lVar16 + lVar13);
      auVar6 = vrcpps_avx(auVar18);
      fVar21 = auVar1._0_4_ * auVar6._0_4_;
      fVar22 = auVar1._4_4_ * auVar6._4_4_;
      fVar23 = auVar1._8_4_ * auVar6._8_4_;
      fVar24 = auVar1._12_4_ * auVar6._12_4_;
      in_register_000012dc = 0.0;
      auVar20._0_4_ = auVar18._0_4_ * fVar21;
      auVar20._4_4_ = auVar18._4_4_ * fVar22;
      auVar20._8_4_ = auVar18._8_4_ * fVar23;
      auVar20._12_4_ = auVar18._12_4_ * fVar24;
      auVar1 = vsubps_avx(auVar1,auVar20);
      auVar18._0_4_ = fVar21 + auVar6._0_4_ * auVar1._0_4_;
      auVar18._4_4_ = fVar22 + auVar6._4_4_ * auVar1._4_4_;
      auVar18._8_4_ = fVar23 + auVar6._8_4_ * auVar1._8_4_;
      auVar18._12_4_ = fVar24 + auVar6._12_4_ * auVar1._12_4_;
      *(undefined1 (*) [16])((long)pvVar4 + lVar16 + lVar15) = auVar18;
      lVar16 = lVar16 + 0x10;
      lVar11 = lVar11 + 4;
    }
    for (; (int)lVar11 < iVar9; lVar11 = lVar11 + 1) {
      *(float *)((long)pvVar4 + lVar11 * 4 + lVar15) =
           *(float *)((long)pvVar5 + lVar11 * 4 + lVar14) /
           *(float *)((long)pvVar3 + lVar11 * 4 + lVar13);
    }
  }
  return iVar9;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}